

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall
QFormLayout::getLayoutPosition(QFormLayout *this,QLayout *layout,int *rowPtr,ItemRole *rolePtr)

{
  int iVar1;
  undefined1 *puVar2;
  int *in_RCX;
  undefined8 in_RDX;
  QFormLayout *in_RSI;
  long *in_RDI;
  int index;
  int n;
  QLayoutItem *local_38;
  int iVar3;
  int index_00;
  
  iVar1 = (**(code **)(*in_RDI + 200))();
  for (iVar3 = 0; index_00 = (int)((ulong)in_RDX >> 0x20), iVar3 < iVar1; iVar3 = iVar3 + 1) {
    puVar2 = (undefined1 *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar3);
    index_00 = (int)((ulong)in_RDX >> 0x20);
    local_38 = (QLayoutItem *)0x0;
    if (in_RSI != (QFormLayout *)0x0) {
      local_38 = &(in_RSI->super_QLayout).super_QLayoutItem;
    }
    if ((QLayoutItem *)puVar2 == local_38) break;
  }
  getItemPosition(in_RSI,index_00,in_RCX,(ItemRole *)CONCAT44(iVar1,iVar3));
  return;
}

Assistant:

void QFormLayout::getLayoutPosition(QLayout *layout, int *rowPtr, ItemRole *rolePtr) const
{
    int n = count();
    int index = 0;
    while (index < n) {
        if (itemAt(index) == layout)
            break;
        ++index;
    }
    getItemPosition(index, rowPtr, rolePtr);
}